

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O2

string * QPDFExc::createWhat(string *__return_storage_ptr__,string *filename,string *object,
                            qpdf_offset_t offset,string *message)

{
  size_type sVar1;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  sVar1 = object->_M_string_length;
  if (offset < 0 && sVar1 == 0) goto LAB_001566a5;
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar1 = object->_M_string_length;
  }
  if (sVar1 == 0) {
    if (-1 < offset) goto LAB_00156651;
  }
  else {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    if (-1 < offset) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00156651:
      std::__cxx11::to_string(&sStack_68,offset);
      std::operator+(&local_48,"offset ",&sStack_68);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
  }
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
LAB_001566a5:
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFExc::createWhat(
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message)
{
    std::string result;
    if (!filename.empty()) {
        result += filename;
    }
    if (!(object.empty() && offset < 0)) {
        if (!filename.empty()) {
            result += " (";
        }
        if (!object.empty()) {
            result += object;
            if (offset >= 0) {
                result += ", ";
            }
        }
        if (offset >= 0) {
            result += "offset " + std::to_string(offset);
        }
        if (!filename.empty()) {
            result += ")";
        }
    }
    if (!result.empty()) {
        result += ": ";
    }
    result += message;
    return result;
}